

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

int Aig_ManPartitionedSat
              (Aig_Man_t *p,int nAlgo,int nPartSize,int nConfPart,int nConfTotal,int fAlignPol,
              int fSynthesize,int fVerbose)

{
  Vec_Ptr_t *pSat_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  abctime aVar5;
  Aig_Man_t *pAVar6;
  Vec_Int_t *vNode2Var_00;
  Aig_Man_t *pAVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *vPartPos;
  abctime clk;
  int RetValue;
  int status;
  int i;
  int nNodes;
  int nConfRemaining;
  Vec_Int_t *vNode2Var;
  Vec_Int_t *vNode2Part;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig;
  Vec_Vec_t *vPart2Pos;
  Vec_Vec_t *vPio2Id;
  Vec_Ptr_t *vAigs;
  sat_solver *pSat;
  uint local_28;
  int fAlignPol_local;
  int nConfTotal_local;
  int nConfPart_local;
  int nPartSize_local;
  int nAlgo_local;
  Aig_Man_t *p_local;
  
  status = 0;
  clk._4_4_ = -1;
  pSat._4_4_ = fAlignPol;
  local_28 = nConfTotal;
  fAlignPol_local = nConfPart;
  nConfTotal_local = nPartSize;
  nConfPart_local = nAlgo;
  _nPartSize_local = p;
  aVar4 = Abc_Clock();
  switch(nConfPart_local) {
  case 0:
    vNode2Var = Aig_ManPartitionMonolithic(_nPartSize_local);
    break;
  case 1:
    vNode2Var = Aig_ManPartitionLevelized(_nPartSize_local,nConfTotal_local);
    break;
  case 2:
    vNode2Var = Aig_ManPartitionDfs(_nPartSize_local,nConfTotal_local,0);
    break;
  case 3:
    vNode2Var = Aig_ManPartitionDfs(_nPartSize_local,nConfTotal_local,1);
    break;
  default:
    printf("Unknown partitioning algorithm.\n");
    return -1;
  }
  if (fVerbose != 0) {
    iVar1 = Vec_IntFindMax(vNode2Var);
    printf("Partitioning derived %d partitions. ",(ulong)(iVar1 + 1));
    Abc_Print(1,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
  }
  vPio2Id = (Vec_Vec_t *)
            Aig_ManPartSplit(_nPartSize_local,vNode2Var,(Vec_Ptr_t **)&vPart2Pos,(Vec_Ptr_t **)&pAig
                            );
  Vec_IntFree(vNode2Var);
  if (fVerbose != 0) {
    printf("Partions were transformed into AIGs. ");
    Abc_Print(1,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
  }
  if (fSynthesize != 0) {
    for (RetValue = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vPio2Id), RetValue < iVar1;
        RetValue = RetValue + 1) {
      pAVar6 = (Aig_Man_t *)Vec_PtrEntry((Vec_Ptr_t *)vPio2Id,RetValue);
      pAVar7 = Dar_ManRwsat(pAVar6,0,0);
      Vec_PtrWriteEntry((Vec_Ptr_t *)vPio2Id,RetValue,pAVar7);
      Aig_ManStop(pAVar6);
    }
  }
  vAigs = (Vec_Ptr_t *)sat_solver_new();
  iVar1 = Aig_ManObjNumMax(_nPartSize_local);
  vNode2Var_00 = Vec_IntStart(iVar1);
  RetValue = 0;
  i = nConfTotal;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)vPio2Id);
    if (iVar1 <= RetValue) {
LAB_008682e3:
      if (clk._4_4_ == 0) {
        Aig_ManDeriveCounterExample(_nPartSize_local,vNode2Var_00,(sat_solver *)vAigs);
      }
      sat_solver_delete((sat_solver *)vAigs);
      for (RetValue = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vPio2Id), RetValue < iVar1;
          RetValue = RetValue + 1) {
        pAVar6 = (Aig_Man_t *)Vec_PtrEntry((Vec_Ptr_t *)vPio2Id,RetValue);
        Aig_ManStop(pAVar6);
      }
      Vec_PtrFree((Vec_Ptr_t *)vPio2Id);
      Vec_VecFree(vPart2Pos);
      Vec_VecFree((Vec_Vec_t *)pAig);
      Vec_IntFree(vNode2Var_00);
      return clk._4_4_;
    }
    pAVar7 = (Aig_Man_t *)Vec_PtrEntry((Vec_Ptr_t *)vPio2Id,RetValue);
    aVar4 = Abc_Clock();
    pAVar6 = _nPartSize_local;
    if (pSat._4_4_ == 0) {
      Aig_ManPartResetNodePolarity(pAVar7);
    }
    else {
      pVVar8 = Vec_VecEntryInt(vPart2Pos,RetValue);
      Aig_ManPartSetNodePolarity(pAVar6,pAVar7,pVVar8);
    }
    pSat_00 = vAigs;
    pVVar8 = Vec_VecEntryInt(vPart2Pos,RetValue);
    vPartPos = Vec_VecEntry((Vec_Vec_t *)pAig,RetValue);
    iVar1 = Aig_ManAddNewCnfToSolver
                      ((sat_solver *)pSat_00,pAVar7,vNode2Var_00,pVVar8,vPartPos,pSat._4_4_);
    if (iVar1 != 0) {
      clk._4_4_ = 1;
      goto LAB_008682e3;
    }
    iVar1 = sat_solver_solve((sat_solver *)vAigs,(lit *)0x0,(lit *)0x0,(long)i,0,0,0);
    if (fVerbose != 0) {
      iVar2 = Aig_ManNodeNum(pAVar7);
      status = iVar2 + status;
      uVar3 = sat_solver_nvars((sat_solver *)vAigs);
      printf("%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",(ulong)(uint)RetValue,
             (ulong)(uint)status,(ulong)uVar3,(ulong)(uint)vAigs[0x19].nSize,
             (ulong)*(uint *)&vAigs[0x19].pArray);
      Abc_Print(1,"%s =","Time");
      aVar5 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
    }
    if (iVar1 == -1) {
      clk._4_4_ = 1;
      goto LAB_008682e3;
    }
    if (iVar1 == 1) {
      clk._4_4_ = 0;
    }
    else {
      clk._4_4_ = -1;
    }
    i = i - (int)vAigs[0x1b].pArray;
    if (i < 1) {
      printf("Exceeded the limit on the total number of conflicts (%d).\n",(ulong)local_28);
      goto LAB_008682e3;
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Aig_ManPartitionedSat( Aig_Man_t * p, int nAlgo, int nPartSize, 
    int nConfPart, int nConfTotal, int fAlignPol, int fSynthesize, int fVerbose )
{
    sat_solver * pSat;
    Vec_Ptr_t * vAigs;
    Vec_Vec_t * vPio2Id, * vPart2Pos;
    Aig_Man_t * pAig, * pTemp;
    Vec_Int_t * vNode2Part, * vNode2Var;
    int nConfRemaining = nConfTotal, nNodes = 0;
    int i, status, RetValue = -1;
    abctime clk;

    // perform partitioning according to the selected algorithm
    clk = Abc_Clock();
    switch ( nAlgo )
    {
    case 0: 
        vNode2Part = Aig_ManPartitionMonolithic( p );
        break;
    case 1: 
        vNode2Part = Aig_ManPartitionLevelized( p, nPartSize );
        break;
    case 2: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 0 );
        break;
    case 3: 
        vNode2Part = Aig_ManPartitionDfs( p, nPartSize, 1 );
        break;
    default:
        printf( "Unknown partitioning algorithm.\n" );
        return -1;
    }

    if ( fVerbose )
    {
    printf( "Partitioning derived %d partitions. ", Vec_IntFindMax(vNode2Part) + 1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // split the original AIG into partition AIGs (vAigs)
    // also, derives mapping of PIs/POs of partition AIGs into original nodes
    // also, derives mapping of POs of the original AIG into partitions
    vAigs = Aig_ManPartSplit( p, vNode2Part, (Vec_Ptr_t **)&vPio2Id, (Vec_Ptr_t **)&vPart2Pos );
    Vec_IntFree( vNode2Part );

    if ( fVerbose )
    {
    printf( "Partions were transformed into AIGs. " );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // synthesize partitions
    if ( fSynthesize )
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
        pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 );
        Vec_PtrWriteEntry( vAigs, i, pAig );
        Aig_ManStop( pTemp );
    }

    // start the SAT solver
    pSat = sat_solver_new();
//    pSat->verbosity = fVerbose;
    // start mapping of the original AIG IDs into their SAT variable numbers
    vNode2Var = Vec_IntStart( Aig_ManObjNumMax(p) );

    // add partitions, one at a time, and run the SAT solver 
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pAig, i )
    {
clk = Abc_Clock();
        // transform polarity of the AIG
        if ( fAlignPol )
            Aig_ManPartSetNodePolarity( p, pAig, Vec_VecEntryInt(vPio2Id,i) );
        else
            Aig_ManPartResetNodePolarity( pAig );
        // add CNF of this partition to the SAT solver
        if ( Aig_ManAddNewCnfToSolver( pSat, pAig, vNode2Var, 
            Vec_VecEntryInt(vPio2Id,i), Vec_VecEntry(vPart2Pos,i), fAlignPol ) )
        {
            RetValue = 1;
            break;
        }
        // call the SAT solver
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfRemaining, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "%4d : Aig = %6d. Vs = %7d. RootCs = %7d. LearnCs = %6d. ",
                i, nNodes += Aig_ManNodeNum(pAig), sat_solver_nvars(pSat), 
                (int)pSat->stats.clauses, (int)pSat->stats.learnts );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
        // analize the result
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        else if ( status == l_True )
            RetValue = 0;
        else
            RetValue = -1;
        nConfRemaining -= pSat->stats.conflicts;
        if ( nConfRemaining <= 0 )
        {
            printf( "Exceeded the limit on the total number of conflicts (%d).\n", nConfTotal );
            break;
        }
    }
    if ( RetValue == 0 )
        Aig_ManDeriveCounterExample( p, vNode2Var, pSat );
    // cleanup
    sat_solver_delete( pSat );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
    Vec_VecFree( vPio2Id );
    Vec_VecFree( vPart2Pos );
    Vec_IntFree( vNode2Var );
    return RetValue;
}